

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O1

bool __thiscall
Opcode::AABBTreeCollider::Collide
          (AABBTreeCollider *this,AABBCollisionTree *tree0,AABBCollisionTree *tree1,
          Matrix4x4 *world0,Matrix4x4 *world1,Pair *cache)

{
  udword *puVar1;
  bool bVar2;
  
  InitQuery(this,world0,world1);
  bVar2 = CheckTemporalCoherence(this,cache);
  if (!bVar2) {
    _Collide(this,tree0->mNodes,tree1->mNodes);
    if ((cache != (Pair *)0x0) && (((this->super_Collider).mFlags & 4) != 0)) {
      puVar1 = (this->mPairs).mEntries;
      cache->id0 = *puVar1;
      cache->id1 = puVar1[1];
    }
  }
  return true;
}

Assistant:

bool AABBTreeCollider::Collide(const AABBCollisionTree* tree0, const AABBCollisionTree* tree1, const Matrix4x4* world0, const Matrix4x4* world1, Pair* cache)
{
	// Init collision query
	InitQuery(world0, world1);

	// Check previous state
	if(CheckTemporalCoherence(cache))		return true;

	// Perform collision query
	_Collide(tree0->GetNodes(), tree1->GetNodes());

	UPDATE_CACHE

	return true;
}